

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtManifoldResult.cpp
# Opt level: O2

cbtScalar cbtManifoldResult::calculateCombinedContactStiffness
                    (cbtCollisionObject *body0,cbtCollisionObject *body1)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  
  auVar2._8_4_ = 0x3f800000;
  auVar2._0_8_ = 0x3f8000003f800000;
  auVar2._12_4_ = 0x3f800000;
  auVar1 = vinsertps_avx(ZEXT416((uint)body0->m_contactStiffness),
                         ZEXT416((uint)body1->m_contactStiffness),0x10);
  auVar1 = vdivps_avx(auVar2,auVar1);
  auVar1 = vhaddps_avx(auVar1,auVar1);
  return 1.0 / auVar1._0_4_;
}

Assistant:

cbtScalar cbtManifoldResult::calculateCombinedContactStiffness(const cbtCollisionObject* body0, const cbtCollisionObject* body1)
{
	cbtScalar s0 = body0->getContactStiffness();
	cbtScalar s1 = body1->getContactStiffness();

	cbtScalar tmp0 = cbtScalar(1) / s0;
	cbtScalar tmp1 = cbtScalar(1) / s1;
	cbtScalar combinedStiffness = cbtScalar(1) / (tmp0 + tmp1);
	return combinedStiffness;
}